

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler *pResampler,float *pFrameOut)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = pResampler->inTimeFrac;
  uVar3 = (pResampler->config).sampleRateOut;
  uVar4 = (pResampler->config).channels;
  for (uVar5 = 0; uVar5 < uVar4; uVar5 = uVar5 + 1) {
    fVar1 = *(float *)((long)&pResampler->x0 + uVar5 * 4);
    pFrameOut[uVar5] =
         (*(float *)((long)&pResampler->x1 + uVar5 * 4) - fVar1) * ((float)uVar2 / (float)uVar3) +
         fVar1;
  }
  return;
}

Assistant:

static void ma_linear_resampler_interpolate_frame_f32(ma_linear_resampler* pResampler, float* pFrameOut)
{
    ma_uint32 c;
    float a;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (float)pResampler->inTimeFrac / pResampler->config.sampleRateOut;

    for (c = 0; c < pResampler->config.channels; c += 1) {
        float s = ma_mix_f32_fast(pResampler->x0.f32[c], pResampler->x1.f32[c], a);
        pFrameOut[c] = s;
    }
}